

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::MultiReporter::testCasePartialEnded
          (MultiReporter *this,TestCaseStats *testStats,uint64_t partNumber)

{
  pointer puVar1;
  unique_ptr<Catch::IEventListener> *reporterish;
  pointer puVar2;
  
  if (((this->super_IEventListener).m_preferences.shouldRedirectStdOut == true) &&
     (this->m_haveNoncapturingReporters == true)) {
    if ((testStats->stdOut)._M_string_length != 0) {
      std::operator<<((ostream *)&std::cout,(string *)&testStats->stdOut);
      std::ostream::flush();
    }
    if ((testStats->stdErr)._M_string_length != 0) {
      std::operator<<((ostream *)&std::cerr,(string *)&testStats->stdErr);
      std::ostream::flush();
    }
  }
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->m_reporterLikes).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*puVar2->m_ptr->_vptr_IEventListener[0xf])(puVar2->m_ptr,testStats,partNumber);
  }
  return;
}

Assistant:

void MultiReporter::testCasePartialEnded( TestCaseStats const& testStats,
                                                  uint64_t partNumber ) {
        if ( m_preferences.shouldRedirectStdOut &&
             m_haveNoncapturingReporters ) {
            if ( !testStats.stdOut.empty() ) {
                Catch::cout() << testStats.stdOut << std::flush;
            }
            if ( !testStats.stdErr.empty() ) {
                Catch::cerr() << testStats.stdErr << std::flush;
            }
        }

        for ( auto& reporterish : m_reporterLikes ) {
            reporterish->testCasePartialEnded( testStats, partNumber );
        }
    }